

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateDirectFieldStore(Lowerer *this,Instr *instrStFld,PropertySymOpnd *propertySymOpnd)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  Opnd *pOVar4;
  undefined4 *puVar5;
  RegOpnd *baseOpnd;
  IndirOpnd *opndDst_00;
  MemRefOpnd *pMVar6;
  intptr_t iVar7;
  LowererMD *pLVar8;
  MemRefOpnd *opndDst_1;
  IndirOpnd *opndDst;
  uint16 index;
  Opnd *opndSlotArray;
  Func *func;
  PropertySymOpnd *propertySymOpnd_local;
  Instr *instrStFld_local;
  Lowerer *this_local;
  
  func_00 = instrStFld->m_func;
  pOVar4 = LoadSlotArrayWithCachedLocalType(this,instrStFld,propertySymOpnd);
  uVar3 = IR::PropertySymOpnd::GetSlotIndex(propertySymOpnd);
  if (uVar3 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cb3,"(index != (uint16)-1)","index != (uint16)-1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
  if (bVar2) {
    baseOpnd = IR::Opnd::AsRegOpnd(pOVar4);
    opndDst_00 = IR::IndirOpnd::New(baseOpnd,(uint)uVar3 << 3,TyInt64,func_00,false);
    pLVar8 = GetLowererMD(this);
    pOVar4 = IR::Instr::GetSrc1(instrStFld);
    LowererMD::GenerateWriteBarrierAssign(pLVar8,opndDst_00,pOVar4,instrStFld);
  }
  else {
    bVar2 = IR::Opnd::IsMemRefOpnd(pOVar4);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1cbd,"(opndSlotArray->IsMemRefOpnd())","opndSlotArray->IsMemRefOpnd()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pMVar6 = IR::Opnd::AsMemRefOpnd(pOVar4);
    iVar7 = IR::MemRefOpnd::GetMemLoc(pMVar6);
    pMVar6 = IR::MemRefOpnd::New((void *)(iVar7 + (ulong)uVar3 * 8),TyInt64,func_00,
                                 AddrOpndKindDynamicMisc);
    pLVar8 = GetLowererMD(this);
    pOVar4 = IR::Instr::GetSrc1(instrStFld);
    LowererMD::GenerateWriteBarrierAssign(pLVar8,pMVar6,pOVar4,instrStFld);
  }
  return;
}

Assistant:

void
Lowerer::GenerateDirectFieldStore(IR::Instr* instrStFld, IR::PropertySymOpnd* propertySymOpnd)
{
    Func* func = instrStFld->m_func;

    IR::Opnd *opndSlotArray = this->LoadSlotArrayWithCachedLocalType(instrStFld, propertySymOpnd);

    // Store the value to the slot, getting the slot index from the cache.
    uint16 index = propertySymOpnd->GetSlotIndex();
    AssertOrFailFast(index != (uint16)-1);

#if defined(RECYCLER_WRITE_BARRIER_JIT) && (defined(_M_IX86) || defined(_M_AMD64))
    if (opndSlotArray->IsRegOpnd())
    {
        IR::IndirOpnd * opndDst = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, func);
        this->GetLowererMD()->GenerateWriteBarrierAssign(opndDst, instrStFld->GetSrc1(), instrStFld);
    }
    else
    {
        Assert(opndSlotArray->IsMemRefOpnd());
        IR::MemRefOpnd * opndDst = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, func);
        this->GetLowererMD()->GenerateWriteBarrierAssign(opndDst, instrStFld->GetSrc1(), instrStFld);
    }
#else
    IR::Opnd *opnd;

    if (opndSlotArray->IsRegOpnd())
    {
        opnd = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, func);
    }
    else
    {
        opnd = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, func);
    }

    this->InsertMove(opnd, instrStFld->GetSrc1(), instrStFld);
#endif
}